

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::OnTestCaseEnd(StreamingListener *this,TestCase *test_case)

{
  bool bVar1;
  String local_60;
  String local_50;
  TimeInMillis local_40;
  string local_38;
  
  bVar1 = TestCase::Passed(test_case);
  local_40 = test_case->elapsed_time_;
  StreamableToString<long_long>((internal *)&local_50,&local_40);
  String::Format((char *)&local_60,"event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",(ulong)bVar1,
                 local_50.c_str_);
  String::operator_cast_to_string(&local_38,&local_60);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  String::~String(&local_60);
  String::~String(&local_50);
  return;
}

Assistant:

void OnTestCaseEnd(const TestCase& test_case) {
    Send(String::Format("event=TestCaseEnd&passed=%d&elapsed_time=%sms\n",
                        test_case.Passed(),
                        StreamableToString(test_case.elapsed_time()).c_str()));
  }